

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPDeviceClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDeviceClause *this)

{
  string clause_string;
  allocator<char> local_50 [8];
  ulong local_48;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"device ",local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"(",(allocator<char> *)&local_30);
  if ((this->modifier == OMPC_DEVICE_MODIFIER_ancestor) ||
     (this->modifier == OMPC_DEVICE_MODIFIER_device_num)) {
    std::__cxx11::string::append((char *)local_50);
  }
  if (1 < local_48) {
    std::__cxx11::string::append((char *)local_50);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_30,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)local_50);
  if (3 < local_48) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDeviceClause::toString() {

    std::string result = "device ";
    std::string clause_string = "(";
    OpenMPDeviceClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_DEVICE_MODIFIER_ancestor:
            clause_string += "ancestor";
            break;
        case OMPC_DEVICE_MODIFIER_device_num:
            clause_string += "device_num";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}